

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

int __thiscall
FIX::ThreadedSocketConnection::connect
          (ThreadedSocketConnection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socket_handle sVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ThreadedSocketConnection *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) || (this->m_sourcePort != 0)) {
    sVar1 = this->m_socket;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    socket_bind(sVar1,pcVar4,this->m_sourcePort);
  }
  sVar1 = getSocket(this);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = socket_connect(sVar1,pcVar4,this->m_port);
  return CONCAT31((int3)((uint)iVar2 >> 8),-1 < iVar2);
}

Assistant:

bool ThreadedSocketConnection::connect() {
  // do the bind in the thread as name resolution may block
  if (!m_sourceAddress.empty() || m_sourcePort) {
    socket_bind(m_socket, m_sourceAddress.c_str(), m_sourcePort);
  }

  return socket_connect(getSocket(), m_address.c_str(), m_port) >= 0;
}